

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O3

void bson_init(bson_t *bson)

{
  uint8_t *puVar1;
  undefined8 *puVar2;
  
  if (bson != (bson_t *)0x0) {
    bson->flags = 3;
    bson->len = 5;
    bson->padding[0] = '\x05';
    bson->padding[1] = '\0';
    bson->padding[2] = '\0';
    bson->padding[3] = '\0';
    bson->padding[4] = '\0';
    return;
  }
  bson_init_cold_1();
  if (bson != (bson_t *)0x0) {
    if ((bson->flags & 1) == 0) {
      puVar1 = (uint8_t *)(**(long **)(bson->padding + 0x10) + *(long *)(bson->padding + 0x20));
    }
    else {
      puVar1 = bson->padding;
    }
    bson->len = 5;
    *puVar1 = '\x05';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    return;
  }
  bson_reinit_cold_1();
  puVar2 = (undefined8 *)bson_malloc(0x80);
  *puVar2 = 0x500000001;
  *(undefined1 *)(puVar2 + 1) = 5;
  *(undefined4 *)((long)puVar2 + 9) = 0;
  return;
}

Assistant:

void
bson_init (bson_t *bson)
{
   bson_impl_inline_t *impl = (bson_impl_inline_t *) bson;

   BSON_ASSERT (bson);

   impl->flags = BSON_FLAG_INLINE | BSON_FLAG_STATIC;
   impl->len = 5;
   impl->data[0] = 5;
   impl->data[1] = 0;
   impl->data[2] = 0;
   impl->data[3] = 0;
   impl->data[4] = 0;
}